

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRFunction * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::allocate<spirv_cross::SPIRFunction&>
          (ObjectPool<spirv_cross::SPIRFunction> *this,SPIRFunction *p)

{
  Vector<spirv_cross::SPIRFunction_*> *this_00;
  bool bVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRFunction_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
  _Var2;
  _Head_base<0UL,_spirv_cross::SPIRFunction_*,_false> _Var3;
  size_t sVar4;
  ulong uVar5;
  SPIRFunction *pSVar6;
  
  this_00 = &this->vacants;
  sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
  if (sVar4 == 0) {
    sVar4 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
            .buffer_size;
    uVar5 = (ulong)(this->start_object_count << ((byte)sVar4 & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>)malloc(uVar5 * 800);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl ==
        (SPIRFunction *)0x0) {
      return (SPIRFunction *)0x0;
    }
    if (uVar5 != 0) {
      sVar4 = 0;
      _Var3._M_head_impl =
           (SPIRFunction *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRFunction_*,_0UL>::reserve(this_00,sVar4 + 1);
        sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.ptr[sVar4] =
             _Var3._M_head_impl;
        sVar4 = sVar4 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size = sVar4;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      sVar4 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar4 + 1);
    sVar4 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
    .ptr[sVar4]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRFunction_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false> =
         _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
    .buffer_size = sVar4 + 1;
    sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
    pSVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.ptr[sVar4 - 1];
    if (sVar4 == 0) goto LAB_00347ea0;
  }
  else {
    pSVar6 = (this_00->super_VectorView<spirv_cross::SPIRFunction_*>).ptr[sVar4 - 1];
  }
  SmallVector<spirv_cross::SPIRFunction_*,_0UL>::resize(this_00,sVar4 - 1);
LAB_00347ea0:
  (pSVar6->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar6->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRFunction_003fa988;
  *(undefined8 *)&(pSVar6->super_IVariant).field_0xc = *(undefined8 *)&(p->super_IVariant).field_0xc
  ;
  (pSVar6->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size = 0;
  (pSVar6->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
       (Parameter *)&(pSVar6->arguments).stack_storage;
  (pSVar6->arguments).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
            (&pSVar6->arguments,&p->arguments);
  (pSVar6->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size = 0;
  (pSVar6->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
       (Parameter *)&(pSVar6->shadow_arguments).stack_storage;
  (pSVar6->shadow_arguments).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
            (&pSVar6->shadow_arguments,&p->shadow_arguments);
  (pSVar6->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
  buffer_size = 0;
  (pSVar6->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
       (TypedID<(spirv_cross::Types)2> *)&(pSVar6->local_variables).stack_storage;
  (pSVar6->local_variables).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::operator=
            (&pSVar6->local_variables,&p->local_variables);
  (pSVar6->entry_block).id = (p->entry_block).id;
  (pSVar6->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size = 0;
  (pSVar6->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr =
       (TypedID<(spirv_cross::Types)6> *)&(pSVar6->blocks).stack_storage;
  (pSVar6->blocks).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL>::operator=
            (&pSVar6->blocks,&p->blocks);
  (pSVar6->combined_parameters).
  super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size = 0;
  (pSVar6->combined_parameters).
  super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr =
       (CombinedImageSamplerParameter *)&(pSVar6->combined_parameters).stack_storage;
  (pSVar6->combined_parameters).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::operator=
            (&pSVar6->combined_parameters,&p->combined_parameters);
  pSVar6->entry_line = p->entry_line;
  (pSVar6->fixup_hooks_out).buffer_capacity = 0;
  (pSVar6->fixup_hooks_out).super_VectorView<std::function<void_()>_>.ptr = (function<void_()> *)0x0
  ;
  (pSVar6->fixup_hooks_out).super_VectorView<std::function<void_()>_>.buffer_size = 0;
  SmallVector<std::function<void_()>,_0UL>::operator=(&pSVar6->fixup_hooks_out,&p->fixup_hooks_out);
  (pSVar6->fixup_hooks_in).super_VectorView<std::function<void_()>_>.ptr = (function<void_()> *)0x0;
  (pSVar6->fixup_hooks_in).super_VectorView<std::function<void_()>_>.buffer_size = 0;
  (pSVar6->fixup_hooks_in).buffer_capacity = 0;
  SmallVector<std::function<void_()>,_0UL>::operator=(&pSVar6->fixup_hooks_in,&p->fixup_hooks_in);
  (pSVar6->constant_arrays_needed_on_stack).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
  (pSVar6->constant_arrays_needed_on_stack).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
       (TypedID<(spirv_cross::Types)0> *)&(pSVar6->constant_arrays_needed_on_stack).stack_storage;
  (pSVar6->constant_arrays_needed_on_stack).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&pSVar6->constant_arrays_needed_on_stack,&p->constant_arrays_needed_on_stack);
  bVar1 = p->flush_undeclared;
  pSVar6->active = p->active;
  pSVar6->flush_undeclared = bVar1;
  pSVar6->do_combined_parameters = p->do_combined_parameters;
  return pSVar6;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}